

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

CursorType * __thiscall
duckdb::QuantileState<long,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
          (QuantileState<long,_duckdb::QuantileStandardType> *this,WindowPartitionInput *partition)

{
  unique_ptr<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>,_true>
  *this_00;
  _Tuple_impl<0UL,_duckdb::QuantileCursor<long>_*,_std::default_delete<duckdb::QuantileCursor<long>_>_>
  __ptr;
  _Tuple_impl<0UL,_duckdb::QuantileCursor<long>_*,_std::default_delete<duckdb::QuantileCursor<long>_>_>
  this_01;
  type pQVar1;
  
  this_00 = &this->window_cursor;
  if ((this->window_cursor).
      super_unique_ptr<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::QuantileCursor<long>_*,_std::default_delete<duckdb::QuantileCursor<long>_>_>
      .super__Head_base<0UL,_duckdb::QuantileCursor<long>_*,_false>._M_head_impl ==
      (QuantileCursor<long> *)0x0) {
    this_01.super__Head_base<0UL,_duckdb::QuantileCursor<long>_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::QuantileCursor<long>_*,_false>)operator_new(0xe0);
    QuantileCursor<long>::QuantileCursor
              ((QuantileCursor<long> *)
               this_01.super__Head_base<0UL,_duckdb::QuantileCursor<long>_*,_false>._M_head_impl,
               partition);
    __ptr.super__Head_base<0UL,_duckdb::QuantileCursor<long>_*,_false>._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::QuantileCursor<long>_*,_std::default_delete<duckdb::QuantileCursor<long>_>_>
         .super__Head_base<0UL,_duckdb::QuantileCursor<long>_*,_false>;
    (this_00->
    super_unique_ptr<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>_>
    )._M_t.
    super___uniq_ptr_impl<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::QuantileCursor<long>_*,_std::default_delete<duckdb::QuantileCursor<long>_>_>
    .super__Head_base<0UL,_duckdb::QuantileCursor<long>_*,_false> =
         this_01.super__Head_base<0UL,_duckdb::QuantileCursor<long>_*,_false>._M_head_impl;
    if (__ptr.super__Head_base<0UL,_duckdb::QuantileCursor<long>_*,_false>._M_head_impl !=
        (QuantileCursor<long> *)0x0) {
      ::std::default_delete<duckdb::QuantileCursor<long>_>::operator()
                ((default_delete<duckdb::QuantileCursor<long>_> *)this_00,
                 (QuantileCursor<long> *)
                 __ptr.super__Head_base<0UL,_duckdb::QuantileCursor<long>_*,_false>._M_head_impl);
    }
  }
  pQVar1 = unique_ptr<duckdb::QuantileCursor<long>,_std::default_delete<duckdb::QuantileCursor<long>_>,_true>
           ::operator*(this_00);
  return pQVar1;
}

Assistant:

CursorType &GetOrCreateWindowCursor(const WindowPartitionInput &partition) {
		if (!window_cursor) {
			window_cursor = make_uniq<CursorType>(partition);
		}
		return *window_cursor;
	}